

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_twoMapVariablesConnection_Test::~Connection_twoMapVariablesConnection_Test
          (Connection_twoMapVariablesConnection_Test *this)

{
  Connection_twoMapVariablesConnection_Test *this_local;
  
  ~Connection_twoMapVariablesConnection_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, twoMapVariablesConnection)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable11\"/>\n"
        "    <variable name=\"variable12\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable21\"/>\n"
        "    <variable name=\"variable22\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\">\n"
        "    <map_variables variable_1=\"variable11\" variable_2=\"variable21\"/>\n"
        "    <map_variables variable_1=\"variable12\" variable_2=\"variable22\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::VariablePtr v11 = libcellml::Variable::create();
    libcellml::VariablePtr v12 = libcellml::Variable::create();
    libcellml::VariablePtr v21 = libcellml::Variable::create();
    libcellml::VariablePtr v22 = libcellml::Variable::create();

    comp1->setName("component1");
    comp2->setName("component2");
    v11->setName("variable11");
    v12->setName("variable12");
    v21->setName("variable21");
    v22->setName("variable22");

    comp1->addVariable(v11);
    comp1->addVariable(v12);
    comp2->addVariable(v21);
    comp2->addVariable(v22);
    m->addComponent(comp1);
    m->addComponent(comp2);
    libcellml::Variable::addEquivalence(v11, v21);
    libcellml::Variable::addEquivalence(v12, v22);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}